

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

bool __thiscall slang::ast::SequenceConcatExpr::admitsEmptyImpl(SequenceConcatExpr *this)

{
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  AssertionExpr *pAVar4;
  pointer pEVar5;
  pointer pEVar6;
  
  if ((this->elements).size_ == 0) {
    assert::assertFailed
              ("it != elements.end()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
               ,0x25e,"bool slang::ast::SequenceConcatExpr::admitsEmptyImpl() const");
  }
  pEVar5 = (this->elements).data_;
  if ((pEVar5->delay).min == 0) {
    pAVar4 = not_null<const_slang::ast::AssertionExpr_*>::get(&pEVar5->sequence);
    bVar2 = AssertionExpr::admitsEmpty(pAVar4);
    if (bVar2) {
      do {
        do {
          pEVar6 = pEVar5;
          pEVar5 = pEVar6 + 1;
          bVar2 = pEVar5 == (this->elements).data_ + (this->elements).size_;
          if (bVar2) {
            return bVar2;
          }
          pAVar4 = not_null<const_slang::ast::AssertionExpr_*>::get(&pEVar6[1].sequence);
          bVar3 = AssertionExpr::admitsEmpty(pAVar4);
          if (!bVar3) {
            return bVar2;
          }
          uVar1 = (pEVar5->delay).min;
        } while (uVar1 == 1);
        if (uVar1 != 0) {
          return bVar2;
        }
      } while ((pEVar6[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged != true) ||
              (pEVar6[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload._M_value != 0));
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool SequenceConcatExpr::admitsEmptyImpl() const {
    auto it = elements.begin();
    ASSERT(it != elements.end());

    // See F.3.4.2.2 for the rules here.
    if (it->delay.min != 0 || !it->sequence->admitsEmpty())
        return false;

    while (++it != elements.end()) {
        if (!it->sequence->admitsEmpty())
            return false;

        if (it->delay.min == 0u && it->delay.max == 0u)
            return false;

        if (it->delay.min > 1)
            return false;
    }

    return true;
}